

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_set_clock(void *chip,UINT32 clock)

{
  code *pcVar1;
  undefined8 uVar2;
  UINT32 UVar3;
  okim6295_state *info;
  UINT32 clock_local;
  void *chip_local;
  
  if (clock == 0) {
    UVar3 = ReadLE32((UINT8 *)((long)chip + 0xf4));
    *(UINT32 *)((long)chip + 0xf0) = UVar3;
  }
  else {
    *(UINT32 *)((long)chip + 0xf0) = clock;
  }
  if (*(long *)((long)chip + 0x108) != 0) {
    pcVar1 = *(code **)((long)chip + 0x108);
    uVar2 = *(undefined8 *)((long)chip + 0x110);
    UVar3 = okim6295_get_rate(chip);
    (*pcVar1)(uVar2,UVar3);
  }
  return;
}

Assistant:

static void okim6295_set_clock(void *chip, UINT32 clock)
{
	okim6295_state *info = (okim6295_state *)chip;
	
	if (clock)
		info->master_clock = clock;	// set to parameter
	else
		info->master_clock = ReadLE32(info->clock_buffer);	// set to value from buffer
	if (info->SmpRateFunc != NULL)
		info->SmpRateFunc(info->SmpRateData, okim6295_get_rate(chip));
}